

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O2

int run_test_handle_type_name(void)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  undefined8 uStackY_40;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  pcVar2 = (char *)uv_handle_type_name(7);
  iVar1 = strcmp(pcVar2,"pipe");
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    pcVar2 = (char *)uv_handle_type_name(0xf);
    iVar1 = strcmp(pcVar2,"udp");
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      pcVar2 = (char *)uv_handle_type_name(0x11);
      iVar1 = strcmp(pcVar2,"file");
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        eval_a = uv_handle_type_name(0x12);
        if (eval_a == 0) {
          eval_a = uv_handle_type_name(0x13);
          if (eval_a == 0) {
            eval_a = uv_handle_type_name(0);
            if (eval_a == 0) {
              return 0;
            }
            pcVar2 = "uv_handle_type_name(UV_UNKNOWN_HANDLE)";
            uStackY_40 = 0x2a;
          }
          else {
            pcVar2 = "uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1)";
            uStackY_40 = 0x29;
          }
        }
        else {
          pcVar2 = "uv_handle_type_name(UV_HANDLE_TYPE_MAX)";
          uStackY_40 = 0x28;
        }
        pcVar3 = "NULL";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
        goto LAB_00143db6;
      }
      pcVar2 = "strcmp(uv_handle_type_name(UV_FILE), \"file\")";
      uStackY_40 = 0x27;
    }
    else {
      pcVar2 = "strcmp(uv_handle_type_name(UV_UDP), \"udp\")";
      uStackY_40 = 0x26;
    }
  }
  else {
    pcVar2 = "strcmp(uv_handle_type_name(UV_NAMED_PIPE), \"pipe\")";
    uStackY_40 = 0x25;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar3 = "0";
LAB_00143db6:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getters-setters.c"
          ,uStackY_40,pcVar2,"==",pcVar3,eval_a,"==",0);
  abort();
}

Assistant:

TEST_IMPL(handle_type_name) {
  ASSERT_OK(strcmp(uv_handle_type_name(UV_NAMED_PIPE), "pipe"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_UDP), "udp"));
  ASSERT_OK(strcmp(uv_handle_type_name(UV_FILE), "file"));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX));
  ASSERT_NULL(uv_handle_type_name(UV_HANDLE_TYPE_MAX + 1));
  ASSERT_NULL(uv_handle_type_name(UV_UNKNOWN_HANDLE));
  return 0;
}